

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

void xmlRegFreeAtom(xmlRegAtomPtr atom)

{
  xmlRegRangePtr pxVar1;
  long lVar2;
  
  if (atom != (xmlRegAtomPtr)0x0) {
    if (0 < atom->nbRanges) {
      lVar2 = 0;
      do {
        pxVar1 = atom->ranges[lVar2];
        if (pxVar1 != (xmlRegRangePtr)0x0) {
          if (pxVar1->blockName != (xmlChar *)0x0) {
            (*xmlFree)(pxVar1->blockName);
          }
          (*xmlFree)(pxVar1);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < atom->nbRanges);
    }
    if (atom->ranges != (xmlRegRangePtr *)0x0) {
      (*xmlFree)(atom->ranges);
    }
    if ((atom->type == XML_REGEXP_STRING) && (atom->valuep != (void *)0x0)) {
      (*xmlFree)(atom->valuep);
    }
    if ((atom->type == XML_REGEXP_STRING) && (atom->valuep2 != (void *)0x0)) {
      (*xmlFree)(atom->valuep2);
    }
    if ((atom->type == XML_REGEXP_BLOCK_NAME) && (atom->valuep != (void *)0x0)) {
      (*xmlFree)(atom->valuep);
    }
    (*xmlFree)(atom);
    return;
  }
  return;
}

Assistant:

static void
xmlRegFreeAtom(xmlRegAtomPtr atom) {
    int i;

    if (atom == NULL)
	return;

    for (i = 0;i < atom->nbRanges;i++)
	xmlRegFreeRange(atom->ranges[i]);
    if (atom->ranges != NULL)
	xmlFree(atom->ranges);
    if ((atom->type == XML_REGEXP_STRING) && (atom->valuep != NULL))
	xmlFree(atom->valuep);
    if ((atom->type == XML_REGEXP_STRING) && (atom->valuep2 != NULL))
	xmlFree(atom->valuep2);
    if ((atom->type == XML_REGEXP_BLOCK_NAME) && (atom->valuep != NULL))
	xmlFree(atom->valuep);
    xmlFree(atom);
}